

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalFirst<true,false>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference this_00;
  pointer pEVar2;
  LogicalType *type;
  type name;
  LogicalType decimal_type;
  size_type *local_190;
  size_type local_188;
  size_type local_180;
  undefined8 uStack_178;
  LogicalType local_170;
  AggregateFunction local_158;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  LogicalType::LogicalType(&local_170,&pEVar2->return_type);
  local_190 = (size_type *)
              (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
  paVar1 = &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190 == paVar1) {
    local_180 = paVar1->_M_allocated_capacity;
    uStack_178 = *(undefined8 *)
                  ((long)&(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                          name.field_2 + 8);
    local_190 = &local_180;
  }
  else {
    local_180 = paVar1->_M_allocated_capacity;
  }
  local_188 = (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
              _M_string_length;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_dataplus._M_p =
       (pointer)paVar1;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_string_length = 0
  ;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.field_2._M_local_buf
  [0] = '\0';
  GetFirstFunction<true,false>(&local_158,(duckdb *)&local_170,type);
  AggregateFunction::operator=(function,&local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_01966bf8;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  ::std::__cxx11::string::operator=
            ((string *)
             &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,
             (string *)&local_190);
  function->distinct_dependent = NOT_DISTINCT_DEPENDENT;
  if (&(function->super_BaseScalarFunction).return_type != &local_170) {
    (function->super_BaseScalarFunction).return_type.id_ = local_170.id_;
    (function->super_BaseScalarFunction).return_type.physical_type_ = local_170.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(function->super_BaseScalarFunction).return_type.type_info_,&local_170.type_info_);
  }
  *(undefined8 *)this = 0;
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  LogicalType::~LogicalType(&local_170);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindDecimalFirst(ClientContext &context, AggregateFunction &function,
                                          vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	auto name = std::move(function.name);
	function = GetFirstFunction<LAST, SKIP_NULLS>(decimal_type);
	function.name = std::move(name);
	function.distinct_dependent = AggregateDistinctDependent::NOT_DISTINCT_DEPENDENT;
	function.return_type = decimal_type;
	return nullptr;
}